

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O0

int Ifn_ManStrCheck2(char *pStr,int *pnInps,int *pnObjs)

{
  int iVar1;
  int local_c0;
  int local_bc;
  int MaxDef;
  int MaxVar;
  int Marks [32];
  int local_2c;
  int i;
  int *pnObjs_local;
  int *pnInps_local;
  char *pStr_local;
  
  memset(&MaxDef,0,0x80);
  local_bc = 0;
  local_c0 = 0;
  for (local_2c = 0; pStr[local_2c] != '\0'; local_2c = local_2c + 1) {
    if ((((((pStr[local_2c] != '=') && (pStr[local_2c] != ';')) && (pStr[local_2c] != '(')) &&
         ((pStr[local_2c] != ')' && (pStr[local_2c] != '[')))) &&
        (((pStr[local_2c] != ']' && ((pStr[local_2c] != '<' && (pStr[local_2c] != '>')))) &&
         (pStr[local_2c] != '{')))) &&
       ((pStr[local_2c] != '}' && ((pStr[local_2c] < 'A' || ('Z' < pStr[local_2c])))))) {
      if ((pStr[local_2c] < 'a') || ('z' < pStr[local_2c])) {
        iVar1 = Ifn_ErrorMessage("String \"%s\" contains unrecognized symbol \'%c\'.\n",pStr,
                                 (ulong)(uint)(int)pStr[local_2c]);
        return iVar1;
      }
      if (pStr[local_2c + 1] == '=') {
        (&MaxDef)[pStr[local_2c] + -0x61] = 2;
        local_c0 = Abc_MaxInt(local_c0,pStr[local_2c] + -0x61);
      }
    }
  }
  local_2c = 0;
  do {
    if (pStr[local_2c] == '\0') {
      local_bc = local_bc + 1;
      local_c0 = local_c0 + 1;
      for (local_2c = 0; local_2c < local_c0; local_2c = local_2c + 1) {
        if ((&MaxDef)[local_2c] == 0) {
          iVar1 = Ifn_ErrorMessage("String \"%s\" has no symbol \'%c\'.\n",pStr,
                                   (ulong)(local_2c + 0x61));
          return iVar1;
        }
      }
      for (local_2c = 0; iVar1 = local_bc, local_2c < local_bc; local_2c = local_2c + 1) {
        if ((&MaxDef)[local_2c] == 2) {
          iVar1 = Ifn_ErrorMessage("String \"%s\" has definition of input variable \'%c\'.\n",pStr,
                                   (ulong)(local_2c + 0x61));
          return iVar1;
        }
      }
      while( true ) {
        local_2c = iVar1;
        if (local_c0 <= local_2c) {
          *pnInps = local_bc;
          *pnObjs = local_c0;
          return 1;
        }
        if ((&MaxDef)[local_2c] == 1) break;
        iVar1 = local_2c + 1;
      }
      iVar1 = Ifn_ErrorMessage("String \"%s\" has no definition for internal variable \'%c\'.\n",
                               pStr,(ulong)(local_2c + 0x61));
      return iVar1;
    }
    if ((((((pStr[local_2c] != '=') && (pStr[local_2c] != ';')) && (pStr[local_2c] != '(')) &&
         (((pStr[local_2c] != ')' && (pStr[local_2c] != '[')) &&
          ((pStr[local_2c] != ']' && ((pStr[local_2c] != '<' && (pStr[local_2c] != '>')))))))) &&
        (pStr[local_2c] != '{')) &&
       ((pStr[local_2c] != '}' && ((pStr[local_2c] < 'A' || ('Z' < pStr[local_2c])))))) {
      if ((pStr[local_2c] < 'a') || ('z' < pStr[local_2c])) {
        iVar1 = Ifn_ErrorMessage("String \"%s\" contains unrecognized symbol \'%c\'.\n",pStr,
                                 (ulong)(uint)(int)pStr[local_2c]);
        return iVar1;
      }
      if ((pStr[local_2c + 1] != '=') && ((&MaxDef)[pStr[local_2c] + -0x61] != 2)) {
        (&MaxDef)[pStr[local_2c] + -0x61] = 1;
        local_bc = Abc_MaxInt(local_bc,pStr[local_2c] + -0x61);
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

int Ifn_ManStrCheck2( char * pStr, int * pnInps, int * pnObjs )
{
    int i, Marks[32] = {0}, MaxVar = 0, MaxDef = 0;
    for ( i = 0; pStr[i]; i++ )
    {
        if ( pStr[i] == '=' || pStr[i] == ';' || 
             pStr[i] == '(' || pStr[i] == ')' || 
             pStr[i] == '[' || pStr[i] == ']' || 
             pStr[i] == '<' || pStr[i] == '>' || 
             pStr[i] == '{' || pStr[i] == '}' )
            continue;
        if ( pStr[i] >= 'A' && pStr[i] <= 'Z' )
            continue;
        if ( pStr[i] >= 'a' && pStr[i] <= 'z' )
        {
            if ( pStr[i+1] == '=' )
                Marks[pStr[i] - 'a'] = 2, MaxDef = Abc_MaxInt(MaxDef, pStr[i] - 'a');
            continue;
        }
        return Ifn_ErrorMessage( "String \"%s\" contains unrecognized symbol \'%c\'.\n", pStr, pStr[i] );
    }
    for ( i = 0; pStr[i]; i++ )
    {
        if ( pStr[i] == '=' || pStr[i] == ';' || 
             pStr[i] == '(' || pStr[i] == ')' || 
             pStr[i] == '[' || pStr[i] == ']' || 
             pStr[i] == '<' || pStr[i] == '>' || 
             pStr[i] == '{' || pStr[i] == '}' )
            continue;
        if ( pStr[i] >= 'A' && pStr[i] <= 'Z' )
            continue;
        if ( pStr[i] >= 'a' && pStr[i] <= 'z' )
        {
            if ( pStr[i+1] != '=' && Marks[pStr[i] - 'a'] != 2 )
                Marks[pStr[i] - 'a'] = 1, MaxVar = Abc_MaxInt(MaxVar, pStr[i] - 'a');
            continue;
        }
        return Ifn_ErrorMessage( "String \"%s\" contains unrecognized symbol \'%c\'.\n", pStr, pStr[i] );
    }
    MaxVar++;
    MaxDef++;
    for ( i = 0; i < MaxDef; i++ )
        if ( Marks[i] == 0 )
            return Ifn_ErrorMessage( "String \"%s\" has no symbol \'%c\'.\n", pStr, 'a' + i );
    for ( i = 0; i < MaxVar; i++ )
        if ( Marks[i] == 2 )
            return Ifn_ErrorMessage( "String \"%s\" has definition of input variable \'%c\'.\n", pStr, 'a' + i );
    for ( i = MaxVar; i < MaxDef; i++ )
        if ( Marks[i] == 1 )
            return Ifn_ErrorMessage( "String \"%s\" has no definition for internal variable \'%c\'.\n", pStr, 'a' + i );
    *pnInps = MaxVar;
    *pnObjs = MaxDef;
    return 1;
}